

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void Assimp::ExportScene3MF
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  D3MFExporter myExporter;
  allocator<char> local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  D3MFExporter local_4e8;
  
  if (pIOSystem == (IOSystem *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,pFile,(allocator<char> *)&local_508);
    std::operator+(&local_4e8.mArchiveName,"Could not export 3MP archive: ",&local_528);
    std::runtime_error::runtime_error(prVar3,(string *)&local_4e8);
    *(undefined ***)prVar3 = &PTR__runtime_error_007da4b8;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  D3MF::D3MFExporter::D3MFExporter(&local_4e8,pFile,pScene);
  if ((local_4e8.mArchiveName._M_string_length != 0) && (local_4e8.mScene != (aiScene *)0x0)) {
    iVar2 = (*pIOSystem->_vptr_IOSystem[2])(pIOSystem,pFile);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,pFile,(allocator<char> *)&local_508);
      iVar2 = (*pIOSystem->_vptr_IOSystem[0xd])(pIOSystem,&local_528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar2 == '\0') {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,pFile,&local_529);
        std::operator+(&local_528,"File exists, cannot override : ",&local_508);
        std::runtime_error::runtime_error(prVar3,(string *)&local_528);
        *(undefined ***)prVar3 = &PTR__runtime_error_007da4b8;
        __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar1 = D3MF::D3MFExporter::exportArchive(&local_4e8,pFile);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,pFile,&local_529);
      std::operator+(&local_528,"Could not export 3MP archive: ",&local_508);
      std::runtime_error::runtime_error(prVar3,(string *)&local_528);
      *(undefined ***)prVar3 = &PTR__runtime_error_007da4b8;
      __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  D3MF::D3MFExporter::~D3MFExporter(&local_4e8);
  return;
}

Assistant:

void ExportScene3MF( const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/ ) {
    if ( nullptr == pIOSystem ) {
        throw DeadlyExportError( "Could not export 3MP archive: " + std::string( pFile ) );
    }
    D3MF::D3MFExporter myExporter( pFile, pScene );
    if ( myExporter.validate() ) {
        if ( pIOSystem->Exists( pFile ) ) {
            if ( !pIOSystem->DeleteFile( pFile ) ) {
                throw DeadlyExportError( "File exists, cannot override : " + std::string( pFile ) );
            }
        }
        bool ok = myExporter.exportArchive(pFile);
        if ( !ok ) {
            throw DeadlyExportError( "Could not export 3MP archive: " + std::string( pFile ) );
        }
    }
}